

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRFunction * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::allocate<unsigned_int&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRFunction> *this,uint *p,uint *p_1)

{
  uint uVar1;
  SPIRFunction *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRFunction **ppSVar4;
  TypeID local_58;
  TypeID local_54;
  SPIRFunction *local_50;
  SPIRFunction *ptr;
  uint local_3c;
  SPIRFunction *pSStack_38;
  uint i;
  SPIRFunction *ptr_1;
  uint *puStack_28;
  uint num_objects;
  uint *p_local_1;
  uint *p_local;
  ObjectPool<spirv_cross::SPIRFunction> *this_local;
  
  puStack_28 = p_1;
  p_local_1 = p;
  p_local = (uint *)this;
  bVar2 = VectorView<spirv_cross::SPIRFunction_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRFunction,_spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_38 = (SPIRFunction *)malloc((ulong)ptr_1._4_4_ * 800);
    if (pSStack_38 == (SPIRFunction *)0x0) {
      return (SPIRFunction *)0x0;
    }
    SmallVector<spirv_cross::SPIRFunction_*,_0UL>::reserve(&this->vacants,(ulong)ptr_1._4_4_);
    for (local_3c = 0; local_3c < ptr_1._4_4_; local_3c = local_3c + 1) {
      ptr = pSStack_38 + local_3c;
      SmallVector<spirv_cross::SPIRFunction_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRFunction*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRFunction,spirv_cross::ObjectPool<spirv_cross::SPIRFunction>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffc8);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRFunction_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRFunction_*>);
  local_50 = *ppSVar4;
  SmallVector<spirv_cross::SPIRFunction_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_50;
  TypedID<(spirv_cross::Types)1>::TypedID(&local_54,*p_local_1);
  TypedID<(spirv_cross::Types)1>::TypedID(&local_58,*puStack_28);
  SPIRFunction::SPIRFunction(this_00,local_54,local_58);
  return local_50;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}